

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> * __thiscall
vkb::PhysicalDeviceSelector::select_devices
          (Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
           *__return_storage_ptr__,PhysicalDeviceSelector *this)

{
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *pvVar1;
  error_code eVar2;
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> selected_devices;
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> local_30;
  
  select_impl(&local_30,this);
  if (local_30.m_init == false) {
    eVar2 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::error
                      (&local_30);
    (__return_storage_ptr__->field_0).m_error.type._M_value = eVar2._M_value;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)eVar2._M_cat;
  }
  else {
    pvVar1 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::value
                       (&local_30);
    if ((pvVar1->super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (pvVar1->super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::
               value(&local_30);
      Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::Result
                (__return_storage_ptr__,pvVar1);
      goto LAB_0010592f;
    }
    (__return_storage_ptr__->field_0).m_error.type._M_value = 3;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
  }
  (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  __return_storage_ptr__->m_init = false;
LAB_0010592f:
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::destroy
            (&local_30);
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<PhysicalDevice>> PhysicalDeviceSelector::select_devices() const {
    auto const selected_devices = select_impl();
    if (!selected_devices) return Result<std::vector<PhysicalDevice>>{ selected_devices.error() };
    if (selected_devices.value().size() == 0) {
        return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::no_suitable_device };
    }
    return selected_devices.value();
}